

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void codecomp(FuncState *fs,OpCode op,int cond,expdesc *e1,expdesc *e2)

{
  int B;
  int iVar1;
  int iVar2;
  
  B = luaK_exp2RK(fs,e1);
  iVar1 = luaK_exp2RK(fs,e2);
  freeexp(fs,e2);
  freeexp(fs,e1);
  iVar2 = iVar1;
  if (op != OP_EQ && cond == 0) {
    iVar2 = B;
    B = iVar1;
  }
  iVar1 = 1;
  if (op == OP_EQ || cond != 0) {
    iVar1 = cond;
  }
  iVar2 = condjump(fs,op,iVar1,B,iVar2);
  (e1->u).s.info = iVar2;
  e1->k = VJMP;
  return;
}

Assistant:

static void codecomp(FuncState*fs,OpCode op,int cond,expdesc*e1,
expdesc*e2){
int o1=luaK_exp2RK(fs,e1);
int o2=luaK_exp2RK(fs,e2);
freeexp(fs,e2);
freeexp(fs,e1);
if(cond==0&&op!=OP_EQ){
int temp;
temp=o1;o1=o2;o2=temp;
cond=1;
}
e1->u.s.info=condjump(fs,op,cond,o1,o2);
e1->k=VJMP;
}